

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O0

Read<int> __thiscall
Omega_h::binary::swap_bytes<int>(binary *this,Read<int> *array,bool needs_swapping)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar1;
  Read<int> RVar2;
  Write<int> local_b0;
  undefined1 local_a0 [8];
  type f;
  allocator local_79;
  string local_78 [32];
  Read<int> local_58;
  undefined1 local_48 [8];
  Write<int> out;
  bool needs_swapping_local;
  Read<int> *array_local;
  ulong local_10;
  
  out.shared_alloc_.direct_ptr._7_1_ = needs_swapping;
  if (needs_swapping) {
    Read<int>::Read(&local_58,array);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"",&local_79);
    deep_copy<int>((Omega_h *)local_48,(Read<signed_char> *)&local_58,(string *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    Read<int>::~Read(&local_58);
    Write<int>::Write((Write<int> *)local_a0,(Write<int> *)local_48);
    if (((ulong)local_48 & 1) == 0) {
      local_10 = *(size_t *)local_48;
    }
    else {
      local_10 = (ulong)local_48 >> 3;
    }
    parallel_for<Omega_h::binary::swap_bytes<int>(Omega_h::Read<int>,bool)::_lambda(int)_1_>
              ((LO)(local_10 >> 2),(type *)local_a0,"swap_if_needed");
    Write<int>::Write(&local_b0,(Write<int> *)local_48);
    Read<int>::Read((Read<int> *)this,&local_b0);
    Write<int>::~Write(&local_b0);
    swap_bytes<int>(Omega_h::Read<int>,bool)::{lambda(int)#1}::~Read((_lambda_int__1_ *)local_a0);
    Write<int>::~Write((Write<int> *)local_48);
    pvVar1 = extraout_RDX_00;
  }
  else {
    Read<int>::Read((Read<int> *)this,array);
    pvVar1 = extraout_RDX;
  }
  RVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar2.write_.shared_alloc_;
}

Assistant:

Read<T> swap_bytes(Read<T> array, bool needs_swapping) {
  if (!needs_swapping) return array;
  Write<T> out = deep_copy(array);
  auto f = OMEGA_H_LAMBDA(LO i) { SwapBytes<T>::swap(&out[i]); };
  parallel_for(out.size(), f, "swap_if_needed");
  return out;
}